

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse.cpp
# Opt level: O0

int sparse_file_write_block(output_file *out,backed_block *bb)

{
  backed_block_type bVar1;
  uint uVar2;
  backed_block *in_RSI;
  output_file *in_RDI;
  int ret;
  undefined8 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  char *in_stack_ffffffffffffffa8;
  uint in_stack_ffffffffffffffb4;
  int64_t in_stack_ffffffffffffffc8;
  undefined8 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  int local_14;
  
  uVar2 = (uint)((ulong)in_stack_ffffffffffffff98 >> 0x20);
  local_14 = -0x16;
  bVar1 = backed_block_type(in_RSI);
  switch(bVar1) {
  case BACKED_BLOCK_DATA:
    backed_block_len(in_RSI);
    backed_block_data(in_RSI);
    local_14 = write_data_chunk((output_file *)
                                CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),uVar2,
                                (void *)0x1070c8);
    break;
  case BACKED_BLOCK_FILE:
    backed_block_len(in_RSI);
    backed_block_filename(in_RSI);
    backed_block_file_offset(in_RSI);
    local_14 = write_file_chunk(in_RDI,in_stack_ffffffffffffffb4,in_stack_ffffffffffffffa8,
                                CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    break;
  case BACKED_BLOCK_FD:
    backed_block_len(in_RSI);
    backed_block_fd(in_RSI);
    backed_block_file_offset(in_RSI);
    local_14 = write_fd_chunk((output_file *)
                              CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                              (uint)((ulong)in_stack_ffffffffffffffd0 >> 0x20),
                              (int)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    break;
  case BACKED_BLOCK_FILL:
    uVar2 = backed_block_len(in_RSI);
    backed_block_fill_val(in_RSI);
    local_14 = write_fill_chunk((output_file *)CONCAT44(uVar2,in_stack_ffffffffffffffa0),
                                (uint)((ulong)in_RDI >> 0x20),(uint32_t)in_RDI);
  }
  return local_14;
}

Assistant:

static int sparse_file_write_block(struct output_file* out, struct backed_block* bb) {
  int ret = -EINVAL;

  switch (backed_block_type(bb)) {
    case BACKED_BLOCK_DATA:
      ret = write_data_chunk(out, backed_block_len(bb), backed_block_data(bb));
      break;
    case BACKED_BLOCK_FILE:
      ret = write_file_chunk(out, backed_block_len(bb), backed_block_filename(bb),
                             backed_block_file_offset(bb));
      break;
    case BACKED_BLOCK_FD:
      ret = write_fd_chunk(out, backed_block_len(bb), backed_block_fd(bb),
                           backed_block_file_offset(bb));
      break;
    case BACKED_BLOCK_FILL:
      ret = write_fill_chunk(out, backed_block_len(bb), backed_block_fill_val(bb));
      break;
  }

  return ret;
}